

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O0

size_t __thiscall tracing_layer::APITracerContextImp::updateTracerArrays(APITracerContextImp *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  void *pvVar5;
  reference ppAVar6;
  size_t sVar7;
  __pointer_type local_50;
  tracer_array_t *active_tracer_array_shadow;
  _Self local_40;
  _List_node_base *local_38;
  _List_iterator<tracing_layer::APITracerImp_*> local_30;
  iterator itr;
  size_t i;
  size_t newTracerArrayCount;
  tracer_array_t *newTracerArray;
  APITracerContextImp *this_local;
  
  sVar3 = std::__cxx11::
          list<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>::size
                    (&this->enabledTracerImpList);
  if (sVar3 == 0) {
    newTracerArrayCount = (size_t)&this->emptyTracerArray;
  }
  else {
    newTracerArrayCount = (size_t)operator_new(0x10);
    *(size_type *)newTracerArrayCount = sVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0xcb8),0);
    if (SUB168(auVar1 * ZEXT816(0xcb8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    *(void **)(newTracerArrayCount + 8) = pvVar5;
    itr._M_node = (_List_node_base *)0x0;
    std::_List_iterator<tracing_layer::APITracerImp_*>::_List_iterator(&local_30);
    local_38 = (_List_node_base *)
               std::__cxx11::
               list<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>::
               begin(&this->enabledTracerImpList);
    local_30._M_node = local_38;
    while( true ) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>::end
                     (&this->enabledTracerImpList);
      bVar2 = std::operator!=(&local_30,&local_40);
      if (!bVar2) break;
      ppAVar6 = std::_List_iterator<tracing_layer::APITracerImp_*>::operator*(&local_30);
      memcpy((void *)(*(size_type *)(newTracerArrayCount + 8) + (long)itr._M_node * 0xcb8),
             &(*ppAVar6)->tracerFunctions,0xcb8);
      itr._M_node = (_List_node_base *)((long)&(itr._M_node)->_M_next + 1);
      active_tracer_array_shadow =
           (tracer_array_t *)
           std::_List_iterator<tracing_layer::APITracerImp_*>::operator++(&local_30,0);
    }
  }
  local_50 = std::atomic<tracing_layer::tracerArray_*>::load
                       (&this->activeTracerArray,memory_order_relaxed);
  if (local_50 != &this->emptyTracerArray) {
    std::__cxx11::list<tracing_layer::tracerArray_*,_std::allocator<tracing_layer::tracerArray_*>_>
    ::push_back(&this->retiringTracerArrayList,&local_50);
  }
  std::atomic<tracing_layer::tracerArray_*>::store
            (&this->activeTracerArray,(__pointer_type)newTracerArrayCount,memory_order_release);
  sVar7 = testAndFreeRetiredTracers(this);
  return sVar7;
}

Assistant:

size_t APITracerContextImp::updateTracerArrays() {
    tracer_array_t *newTracerArray;
    size_t newTracerArrayCount = this->enabledTracerImpList.size();

    if (newTracerArrayCount != 0) {

        newTracerArray = new tracer_array_t;

        newTracerArray->tracerArrayCount = newTracerArrayCount;
        newTracerArray->tracerArrayEntries =
            new tracer_array_entry_t[newTracerArrayCount];
        //
        // iterate over the list of enabled tracers, copying their entries into the
        // new tracer array
        //
        size_t i = 0;
        std::list<struct APITracerImp *>::iterator itr;
        for (itr = enabledTracerImpList.begin(); itr != enabledTracerImpList.end();
             itr++) {
            newTracerArray->tracerArrayEntries[i] = (*itr)->tracerFunctions;
            i++;
        }

    } else {
        newTracerArray = &emptyTracerArray;
    }
    //
    // active_tracer_array.load can use memory_order_relaxed here because
    // there is logically no transfer of other memory context between
    // threads in this case.
    //
    tracer_array_t *active_tracer_array_shadow =
        activeTracerArray.load(std::memory_order_relaxed);
    if (active_tracer_array_shadow != &emptyTracerArray) {
        retiringTracerArrayList.push_back(active_tracer_array_shadow);
    }
    //
    // This active_tracer_array.store must use memory_order_release.
    // This store DOES signal a logical transfer of tracer state information
    // from this thread to the tracing threads.
    //
    activeTracerArray.store(newTracerArray, std::memory_order_release);
    return testAndFreeRetiredTracers();
}